

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_open.c
# Opt level: O0

zip_t * zip_open_from_source(zip_source_t *src,int _flags,zip_error_t *error)

{
  exists_t eVar1;
  int iVar2;
  ulong uVar3;
  undefined8 local_48;
  zip_t *za;
  exists_t exists;
  zip_int64_t supported;
  uint flags;
  zip_error_t *error_local;
  int _flags_local;
  zip_source_t *src_local;
  
  if ((_flags < 0) || (src == (zip_source_t *)0x0)) {
    zip_error_set(error,0x12,0);
    src_local = (zip_source_t *)0x0;
  }
  else {
    uVar3 = zip_source_supports(src);
    if (zip_open_from_source::needed_support_read == -1) {
      zip_open_from_source::needed_support_read =
           zip_source_make_command_bitmap(ZIP_SOURCE_OPEN,1,2,6,7,3,0xffffffff);
      zip_open_from_source::needed_support_write =
           zip_source_make_command_bitmap(ZIP_SOURCE_BEGIN_WRITE,9,10,0xc,0xd,0xf,0xffffffff);
    }
    if ((uVar3 & zip_open_from_source::needed_support_read) ==
        zip_open_from_source::needed_support_read) {
      supported._4_4_ = _flags;
      if ((uVar3 & zip_open_from_source::needed_support_write) !=
          zip_open_from_source::needed_support_write) {
        supported._4_4_ = _flags | 0x10;
      }
      if ((supported._4_4_ & 0x18) == 0x18) {
        zip_error_set(error,0x19,0);
        src_local = (zip_source_t *)0x0;
      }
      else {
        eVar1 = _zip_file_exists(src,error);
        if (eVar1 == EXISTS_ERROR) {
          src_local = (zip_source_t *)0x0;
        }
        else if (eVar1 == EXISTS_NOT) {
          if ((supported._4_4_ & 1) == 0) {
            zip_error_set(error,9,0);
            src_local = (zip_source_t *)0x0;
          }
          else {
            src_local = (zip_source_t *)_zip_allocate_new(src,supported._4_4_,error);
          }
        }
        else if ((supported._4_4_ & 2) == 0) {
          iVar2 = zip_source_open(src);
          if (iVar2 < 0) {
            _zip_error_set_from_source(error,src);
            src_local = (zip_source_t *)0x0;
          }
          else {
            if ((supported._4_4_ & 8) == 0) {
              local_48 = _zip_open(src,supported._4_4_,error);
            }
            else {
              local_48 = _zip_allocate_new(src,supported._4_4_,error);
            }
            if (local_48 == (zip_t *)0x0) {
              zip_source_close(src);
              src_local = (zip_source_t *)0x0;
            }
            else {
              src_local = (zip_source_t *)local_48;
            }
          }
        }
        else {
          zip_error_set(error,10,0);
          src_local = (zip_source_t *)0x0;
        }
      }
    }
    else {
      zip_error_set(error,0x1c,0);
      src_local = (zip_source_t *)0x0;
    }
  }
  return (zip_t *)src_local;
}

Assistant:

ZIP_EXTERN zip_t *
zip_open_from_source(zip_source_t *src, int _flags, zip_error_t *error) {
    static zip_int64_t needed_support_read = -1;
    static zip_int64_t needed_support_write = -1;

    unsigned int flags;
    zip_int64_t supported;
    exists_t exists;

    if (_flags < 0 || src == NULL) {
	zip_error_set(error, ZIP_ER_INVAL, 0);
	return NULL;
    }
    flags = (unsigned int)_flags;

    supported = zip_source_supports(src);
    if (needed_support_read == -1) {
	needed_support_read = zip_source_make_command_bitmap(ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_SEEK, ZIP_SOURCE_TELL, ZIP_SOURCE_STAT, -1);
	needed_support_write = zip_source_make_command_bitmap(ZIP_SOURCE_BEGIN_WRITE, ZIP_SOURCE_COMMIT_WRITE, ZIP_SOURCE_ROLLBACK_WRITE, ZIP_SOURCE_SEEK_WRITE, ZIP_SOURCE_TELL_WRITE, ZIP_SOURCE_REMOVE, -1);
    }
    if ((supported & needed_support_read) != needed_support_read) {
	zip_error_set(error, ZIP_ER_OPNOTSUPP, 0);
	return NULL;
    }
    if ((supported & needed_support_write) != needed_support_write) {
	flags |= ZIP_RDONLY;
    }

    if ((flags & (ZIP_RDONLY | ZIP_TRUNCATE)) == (ZIP_RDONLY | ZIP_TRUNCATE)) {
	zip_error_set(error, ZIP_ER_RDONLY, 0);
	return NULL;
    }

    exists = _zip_file_exists(src, error);
    switch (exists) {
    case EXISTS_ERROR:
	return NULL;

    case EXISTS_NOT:
	if ((flags & ZIP_CREATE) == 0) {
	    zip_error_set(error, ZIP_ER_NOENT, 0);
	    return NULL;
	}
	return _zip_allocate_new(src, flags, error);

    default: {
	zip_t *za;
	if (flags & ZIP_EXCL) {
	    zip_error_set(error, ZIP_ER_EXISTS, 0);
	    return NULL;
	}
	if (zip_source_open(src) < 0) {
	    _zip_error_set_from_source(error, src);
	    return NULL;
	}

	if (flags & ZIP_TRUNCATE) {
	    za = _zip_allocate_new(src, flags, error);
	}
	else {
	    /* ZIP_CREATE gets ignored if file exists and not ZIP_EXCL, just like open() */
	    za = _zip_open(src, flags, error);
	}

	if (za == NULL) {
	    zip_source_close(src);
	    return NULL;
	}
	return za;
    }
    }
}